

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void CopyPortal(int sectortag,int plane,uint pnum,double alpha,bool tolines)

{
  uint uVar1;
  long lVar2;
  FSectorTagIterator itr_1;
  FSectorTagIterator itr;
  FSectorTagIterator local_40;
  FSectorTagIterator local_38;
  
  if (sectortag == 0) {
    local_38.start = 0;
  }
  else {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)sectortag & 0xff];
  }
  local_38.searchtag = sectortag;
  uVar1 = FSectorTagIterator::Next(&local_38);
  if (-1 < (int)uVar1) {
    do {
      SetPortal((sector_t *)(sectors + uVar1),plane,pnum,alpha);
      uVar1 = FSectorTagIterator::Next(&local_38);
    } while (-1 < (int)uVar1);
  }
  if (0 < numlines) {
    lVar2 = 0;
    do {
      if ((((lines[lVar2].special == 0x39) && (lines[lVar2].args[1] == 1)) &&
          (lines[lVar2].args[2] == plane || lines[lVar2].args[2] == 3)) &&
         (lines[lVar2].args[3] == sectortag)) {
        if (lines[lVar2].args[0] == 0) {
          SetPortal((sector_t *)lines[lVar2].frontsector,plane,pnum,alpha);
        }
        else {
          local_40.searchtag = lines[lVar2].args[0];
          if (local_40.searchtag == 0) {
            local_40.start = 0;
          }
          else {
            local_40.start = tagManager.TagHashFirst[(byte)local_40.searchtag];
          }
          uVar1 = FSectorTagIterator::Next(&local_40);
          while (-1 < (int)uVar1) {
            SetPortal((sector_t *)(sectors + uVar1),plane,pnum,alpha);
            uVar1 = FSectorTagIterator::Next(&local_40);
          }
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < numlines);
  }
  return;
}

Assistant:

static void CopyPortal(int sectortag, int plane, unsigned pnum, double alpha, bool tolines)
{
	int s;
	FSectorTagIterator itr(sectortag);
	while ((s = itr.Next()) >= 0)
	{
		SetPortal(&sectors[s], plane, pnum, alpha);
	}

	for (int j=0;j<numlines;j++)
	{
		// Check if this portal needs to be copied to other sectors
		// This must be done here to ensure that it gets done only after the portal is set up
		if (lines[j].special == Sector_SetPortal &&
			lines[j].args[1] == 1 &&
			(lines[j].args[2] == plane || lines[j].args[2] == 3) &&
			lines[j].args[3] == sectortag)
		{
			if (lines[j].args[0] == 0)
			{
				SetPortal(lines[j].frontsector, plane, pnum, alpha);
			}
			else
			{
				FSectorTagIterator itr(lines[j].args[0]);
				while ((s = itr.Next()) >= 0)
				{
					SetPortal(&sectors[s], plane, pnum, alpha);
				}
			}
		}
	}
}